

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O3

void column_test_base_boundary_z2_methods<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,false>>>>
               (void)

{
  _Rb_tree_color _Var1;
  uint uVar2;
  _Hash_node_base *p_Var3;
  key_type *pkVar4;
  bool bVar5;
  _Base_ptr p_Var6;
  __node_base _Var7;
  _Hash_node_base *p_Var8;
  _Base_ptr p_Var9;
  uint uVar10;
  _Base_ptr p_Var11;
  _Bit_const_iterator __first1;
  _Bit_const_iterator __first1_00;
  _Bit_const_iterator __first1_01;
  _Bit_const_iterator __first1_02;
  _Bit_const_iterator __last1;
  _Bit_const_iterator __last1_00;
  _Bit_const_iterator __last1_01;
  _Bit_const_iterator __last1_02;
  _Bit_const_iterator __first2;
  _Bit_const_iterator __first2_00;
  _Bit_const_iterator __first2_01;
  _Bit_const_iterator __first2_02;
  pair<std::_Rb_tree_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_std::_Rb_tree_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>_>
  pVar12;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  undefined1 local_2c8 [28];
  undefined4 uStack_2ac;
  _Bit_pointer local_2a8;
  undefined4 local_298;
  Column_settings settings;
  char *local_290;
  char *local_288;
  shared_count sStack_280;
  void *local_278;
  undefined4 local_270;
  long local_268;
  uint local_260;
  long local_258;
  size_type local_250;
  undefined4 *local_248;
  size_type *local_240;
  undefined **local_238;
  ulong uStack_230;
  undefined8 *local_228;
  size_type **local_220;
  undefined **local_218;
  ulong local_210;
  shared_count sStack_208;
  char *local_200;
  vector<unsigned_int,_std::allocator<unsigned_int>_> permutation;
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>
  col;
  undefined4 **local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_278 = (void *)0x0;
  local_270 = 0;
  local_268 = 0;
  local_260 = 0;
  local_258 = 0;
  local_238 = (undefined **)0x100000000;
  uStack_230 = 0x500000002;
  local_228 = (undefined8 *)CONCAT44(local_228._4_4_,6);
  __l._M_len = 5;
  __l._M_array = (iterator)&local_238;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2c8,__l,
             (allocator_type *)&local_218);
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,false>>>
  ::Unordered_set_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,false>>>
              *)&col,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2c8,&settings);
  if ((_Bit_type *)local_2c8._0_8_ != (_Bit_type *)0x0) {
    operator_delete((void *)local_2c8._0_8_,
                    CONCAT44(local_2c8._20_4_,local_2c8._16_4_) - local_2c8._0_8_);
  }
  local_2c8._0_7_ = 0x1010000010101;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_278,local_2c8);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x290);
  uVar10 = ((int)local_268 - (int)local_278) * 8 + local_260;
  if ((int)uVar10 < 0) {
    if (col.column_._M_h._M_element_count != 0) {
      _Var7 = col.column_._M_h._M_before_begin;
      for (p_Var3 = (col.column_._M_h._M_before_begin._M_nxt)->_M_nxt;
          p_Var3 != (_Hash_node_base *)0x0; p_Var3 = p_Var3->_M_nxt) {
        p_Var8 = p_Var3;
        if (*(uint *)((long)&(p_Var3[1]._M_nxt)->_M_nxt + 4) <=
            *(uint *)((long)&(_Var7._M_nxt[1]._M_nxt)->_M_nxt + 4)) {
          p_Var8 = _Var7._M_nxt;
        }
        _Var7._M_nxt = p_Var8;
      }
      uVar10 = *(int *)((long)&(_Var7._M_nxt[1]._M_nxt)->_M_nxt + 4) + 1;
      goto LAB_001cb344;
    }
    local_2c8._16_4_ = 0;
    local_2c8._20_4_ = 0;
    local_2c8._24_4_ = 0;
    uStack_2ac = 0;
    local_2c8._0_8_ = (_Bit_type *)0x0;
    local_2c8._8_4_ = 0;
    local_2c8._12_4_ = 0;
    local_2a8 = (_Bit_pointer)0x0;
  }
  else {
LAB_001cb344:
    local_238 = (undefined **)((ulong)local_238 & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_2c8,(long)(int)uVar10,(bool *)&local_238
               ,(allocator_type *)&local_290);
    for (_Var7 = col.column_._M_h._M_before_begin; _Var7._M_nxt != (_Hash_node_base *)0x0;
        _Var7._M_nxt = (_Var7._M_nxt)->_M_nxt) {
      uVar2 = *(uint *)((long)&(_Var7._M_nxt[1]._M_nxt)->_M_nxt + 4);
      if (uVar2 < uVar10) {
        *(ulong *)(local_2c8._0_8_ + (ulong)(uVar2 >> 6) * 8) =
             *(ulong *)(local_2c8._0_8_ + (ulong)(uVar2 >> 6) * 8) | 1L << ((byte)uVar2 & 0x3f);
      }
    }
  }
  __last1.super__Bit_iterator_base._M_p._4_4_ = local_2c8._20_4_;
  __last1.super__Bit_iterator_base._M_p._0_4_ = local_2c8._16_4_;
  __last1.super__Bit_iterator_base._M_offset = local_2c8._24_4_;
  if ((ulong)(uint)local_2c8._24_4_ +
      (CONCAT44(local_2c8._20_4_,local_2c8._16_4_) - local_2c8._0_8_) * 8 ==
      (ulong)local_260 + (local_268 - (long)local_278) * 8) {
    __first1.super__Bit_iterator_base._8_8_ = 0;
    __first1.super__Bit_iterator_base._M_p = (_Bit_type *)local_2c8._0_8_;
    __last1.super__Bit_iterator_base._12_4_ = 0;
    __first2.super__Bit_iterator_base._8_8_ = 0;
    __first2.super__Bit_iterator_base._M_p = (_Bit_type *)local_278;
    bVar5 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1,__last1,__first2);
  }
  else {
    bVar5 = false;
  }
  local_218 = (undefined **)CONCAT71(local_218._1_7_,bVar5);
  local_210 = 0;
  sStack_208.pi_ = (sp_counted_base *)0x0;
  local_220 = (size_type **)&local_290;
  local_290 = "col.get_content(veccont.size()) == veccont";
  local_288 = "";
  uStack_230 = uStack_230 & 0xffffffffffffff00;
  local_238 = &PTR__lazy_ostream_002283b0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  boost::test_tools::tt_detail::report_assertion(&local_218,&local_238,&local_60,0x290,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_208);
  if ((_Bit_type *)local_2c8._0_8_ != (_Bit_type *)0x0) {
    operator_delete((void *)local_2c8._0_8_,(long)local_2a8 - local_2c8._0_8_);
  }
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x291);
  local_210 = local_210 & 0xffffffffffffff00;
  local_218 = &PTR__lazy_ostream_00228440;
  sStack_208.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_200 = "";
  local_180 = &local_248;
  local_248 = (undefined4 *)col.column_._M_h._M_element_count;
  local_240 = &local_250;
  local_290 = (char *)CONCAT71(local_290._1_7_,col.column_._M_h._M_element_count == 5);
  local_250 = CONCAT44(local_250._4_4_,5);
  local_288 = (char *)0x0;
  sStack_280.pi_ = (sp_counted_base *)0x0;
  permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_ae31e;
  permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x1e6932;
  unique0x00005300 = &local_180;
  local_2c8._8_4_ = local_2c8._8_4_ & 0xffffff00;
  local_2c8._0_8_ = &PTR__lazy_ostream_00228400;
  local_2c8._16_4_ = 0x230120;
  local_2c8._20_4_ = 0;
  local_220 = &local_240;
  uStack_230 = uStack_230 & 0xffffffffffffff00;
  local_238 = &PTR__lazy_ostream_002286c0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,&local_218,&permutation,0x291,1,2,2,"col.size()",local_2c8,"5",&local_238);
  boost::detail::shared_count::~shared_count(&sStack_280);
  local_2c8._16_4_ = 1;
  local_2c8._20_4_ = 4;
  local_2c8._24_4_ = 6;
  local_2c8._0_8_ = (_Bit_type *)0x500000000;
  local_2c8._8_4_ = 2;
  local_2c8._12_4_ = 3;
  __l_00._M_len = 7;
  __l_00._M_array = (iterator)local_2c8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&permutation,__l_00,(allocator_type *)&local_238);
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,false>>>
  ::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,false>>>
              *)&col,&permutation,0xffffffff);
  local_2c8._0_7_ = 0x1010100010001;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_278,local_2c8);
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_90,0x296);
  uVar10 = ((int)local_268 - (int)local_278) * 8 + local_260;
  if ((int)uVar10 < 0) {
    if (col.column_._M_h._M_element_count != 0) {
      _Var7 = col.column_._M_h._M_before_begin;
      for (p_Var3 = (col.column_._M_h._M_before_begin._M_nxt)->_M_nxt;
          p_Var3 != (_Hash_node_base *)0x0; p_Var3 = p_Var3->_M_nxt) {
        p_Var8 = p_Var3;
        if (*(uint *)((long)&(p_Var3[1]._M_nxt)->_M_nxt + 4) <=
            *(uint *)((long)&(_Var7._M_nxt[1]._M_nxt)->_M_nxt + 4)) {
          p_Var8 = _Var7._M_nxt;
        }
        _Var7._M_nxt = p_Var8;
      }
      uVar10 = *(int *)((long)&(_Var7._M_nxt[1]._M_nxt)->_M_nxt + 4) + 1;
      goto LAB_001cb3a1;
    }
    local_2c8._16_4_ = 0;
    local_2c8._20_4_ = 0;
    local_2c8._24_4_ = 0;
    uStack_2ac = 0;
    local_2c8._0_8_ = (_Bit_type *)0x0;
    local_2c8._8_4_ = 0;
    local_2c8._12_4_ = 0;
    local_2a8 = (_Bit_pointer)0x0;
  }
  else {
LAB_001cb3a1:
    local_238 = (undefined **)((ulong)local_238 & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_2c8,(long)(int)uVar10,(bool *)&local_238
               ,(allocator_type *)&local_290);
    for (_Var7 = col.column_._M_h._M_before_begin; _Var7._M_nxt != (_Hash_node_base *)0x0;
        _Var7._M_nxt = (_Var7._M_nxt)->_M_nxt) {
      uVar2 = *(uint *)((long)&(_Var7._M_nxt[1]._M_nxt)->_M_nxt + 4);
      if (uVar2 < uVar10) {
        *(ulong *)(local_2c8._0_8_ + (ulong)(uVar2 >> 6) * 8) =
             *(ulong *)(local_2c8._0_8_ + (ulong)(uVar2 >> 6) * 8) | 1L << ((byte)uVar2 & 0x3f);
      }
    }
  }
  __last1_00.super__Bit_iterator_base._M_p._4_4_ = local_2c8._20_4_;
  __last1_00.super__Bit_iterator_base._M_p._0_4_ = local_2c8._16_4_;
  __last1_00.super__Bit_iterator_base._M_offset = local_2c8._24_4_;
  if ((ulong)(uint)local_2c8._24_4_ +
      (CONCAT44(local_2c8._20_4_,local_2c8._16_4_) - local_2c8._0_8_) * 8 ==
      (ulong)local_260 + (local_268 - (long)local_278) * 8) {
    __first1_00.super__Bit_iterator_base._8_8_ = 0;
    __first1_00.super__Bit_iterator_base._M_p = (_Bit_type *)local_2c8._0_8_;
    __last1_00.super__Bit_iterator_base._12_4_ = 0;
    __first2_00.super__Bit_iterator_base._8_8_ = 0;
    __first2_00.super__Bit_iterator_base._M_p = (_Bit_type *)local_278;
    bVar5 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_00,__last1_00,__first2_00);
  }
  else {
    bVar5 = false;
  }
  local_218 = (undefined **)CONCAT71(local_218._1_7_,bVar5);
  local_210 = 0;
  sStack_208.pi_ = (sp_counted_base *)0x0;
  local_290 = "col.get_content(veccont.size()) == veccont";
  local_288 = "";
  uStack_230 = uStack_230 & 0xffffffffffffff00;
  local_238 = &PTR__lazy_ostream_002283b0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  local_220 = (size_type **)&local_290;
  boost::test_tools::tt_detail::report_assertion(&local_218,&local_238,&local_b0,0x296,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_208);
  if ((_Bit_type *)local_2c8._0_8_ != (_Bit_type *)0x0) {
    operator_delete((void *)local_2c8._0_8_,(long)local_2a8 - local_2c8._0_8_);
  }
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x297);
  local_210 = local_210 & 0xffffffffffffff00;
  local_218 = &PTR__lazy_ostream_00228440;
  sStack_208.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_200 = "";
  local_250 = col.column_._M_h._M_element_count;
  local_248 = &local_298;
  local_290 = (char *)CONCAT71(local_290._1_7_,col.column_._M_h._M_element_count == 5);
  local_298 = 5;
  local_288 = (char *)0x0;
  sStack_280.pi_ = (sp_counted_base *)0x0;
  local_180 = (undefined4 **)0x1e68bf;
  local_178 = "";
  local_240 = &local_250;
  local_2c8._8_4_ = local_2c8._8_4_ & 0xffffff00;
  local_2c8._0_8_ = &PTR__lazy_ostream_00228400;
  local_2c8._16_4_ = 0x230120;
  local_2c8._20_4_ = 0;
  unique0x00005300 = (undefined4 ***)&local_240;
  uStack_230 = uStack_230 & 0xffffffffffffff00;
  local_238 = &PTR__lazy_ostream_002286c0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = (size_type **)&local_248;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,&local_218,&local_180,0x297,1,2,2,"col.size()",local_2c8,"5",&local_238);
  boost::detail::shared_count::~shared_count(&sStack_280);
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>
  ::clear(&col,2);
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>
  ::clear(&col,6);
  local_2c8._0_7_ = 0x10100000001;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_278,local_2c8);
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x29c);
  uVar10 = ((int)local_268 - (int)local_278) * 8 + local_260;
  if ((int)uVar10 < 0) {
    if (col.column_._M_h._M_element_count != 0) {
      _Var7 = col.column_._M_h._M_before_begin;
      for (p_Var3 = (col.column_._M_h._M_before_begin._M_nxt)->_M_nxt;
          p_Var3 != (_Hash_node_base *)0x0; p_Var3 = p_Var3->_M_nxt) {
        p_Var8 = p_Var3;
        if (*(uint *)((long)&(p_Var3[1]._M_nxt)->_M_nxt + 4) <=
            *(uint *)((long)&(_Var7._M_nxt[1]._M_nxt)->_M_nxt + 4)) {
          p_Var8 = _Var7._M_nxt;
        }
        _Var7._M_nxt = p_Var8;
      }
      uVar10 = *(int *)((long)&(_Var7._M_nxt[1]._M_nxt)->_M_nxt + 4) + 1;
      goto LAB_001cb3fe;
    }
    local_2c8._16_4_ = 0;
    local_2c8._20_4_ = 0;
    unique0x10000ed4 = (undefined4 ***)0x0;
    local_2c8._0_8_ = (_Bit_type *)0x0;
    local_2c8._8_4_ = 0;
    local_2c8._12_4_ = 0;
    local_2a8 = (_Bit_pointer)0x0;
  }
  else {
LAB_001cb3fe:
    local_238 = (undefined **)((ulong)local_238 & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_2c8,(long)(int)uVar10,(bool *)&local_238
               ,(allocator_type *)&local_290);
    for (_Var7 = col.column_._M_h._M_before_begin; _Var7._M_nxt != (_Hash_node_base *)0x0;
        _Var7._M_nxt = (_Var7._M_nxt)->_M_nxt) {
      uVar2 = *(uint *)((long)&(_Var7._M_nxt[1]._M_nxt)->_M_nxt + 4);
      if (uVar2 < uVar10) {
        *(ulong *)(local_2c8._0_8_ + (ulong)(uVar2 >> 6) * 8) =
             *(ulong *)(local_2c8._0_8_ + (ulong)(uVar2 >> 6) * 8) | 1L << ((byte)uVar2 & 0x3f);
      }
    }
  }
  __last1_01.super__Bit_iterator_base._M_p._4_4_ = local_2c8._20_4_;
  __last1_01.super__Bit_iterator_base._M_p._0_4_ = local_2c8._16_4_;
  __last1_01.super__Bit_iterator_base._M_offset = local_2c8._24_4_;
  if (((ulong)unique0x10000ecc & 0xffffffff) +
      (CONCAT44(local_2c8._20_4_,local_2c8._16_4_) - local_2c8._0_8_) * 8 ==
      (ulong)local_260 + (local_268 - (long)local_278) * 8) {
    __first1_01.super__Bit_iterator_base._8_8_ = 0;
    __first1_01.super__Bit_iterator_base._M_p = (_Bit_type *)local_2c8._0_8_;
    __last1_01.super__Bit_iterator_base._12_4_ = 0;
    __first2_01.super__Bit_iterator_base._8_8_ = 0;
    __first2_01.super__Bit_iterator_base._M_p = (_Bit_type *)local_278;
    bVar5 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_01,__last1_01,__first2_01);
  }
  else {
    bVar5 = false;
  }
  local_218 = (undefined **)CONCAT71(local_218._1_7_,bVar5);
  local_210 = 0;
  sStack_208.pi_ = (sp_counted_base *)0x0;
  local_290 = "col.get_content(veccont.size()) == veccont";
  local_288 = "";
  uStack_230 = uStack_230 & 0xffffffffffffff00;
  local_238 = &PTR__lazy_ostream_002283b0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_f8 = "";
  local_220 = (size_type **)&local_290;
  boost::test_tools::tt_detail::report_assertion(&local_218,&local_238,&local_100,0x29c,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_208);
  if ((_Bit_type *)local_2c8._0_8_ != (_Bit_type *)0x0) {
    operator_delete((void *)local_2c8._0_8_,(long)local_2a8 - local_2c8._0_8_);
  }
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_110,0x29d);
  local_210 = local_210 & 0xffffffffffffff00;
  local_218 = &PTR__lazy_ostream_00228440;
  sStack_208.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_200 = "";
  local_250 = col.column_._M_h._M_element_count;
  local_290 = (char *)CONCAT71(local_290._1_7_,col.column_._M_h._M_element_count == 3);
  local_298 = 3;
  local_288 = (char *)0x0;
  sStack_280.pi_ = (sp_counted_base *)0x0;
  local_180 = (undefined4 **)0x1e68bf;
  local_178 = "";
  local_240 = &local_250;
  local_2c8._8_4_ = local_2c8._8_4_ & 0xffffff00;
  local_2c8._0_8_ = &PTR__lazy_ostream_00228400;
  local_2c8._16_4_ = 0x230120;
  local_2c8._20_4_ = 0;
  unique0x00005300 = (undefined4 ***)&local_240;
  local_248 = &local_298;
  uStack_230 = uStack_230 & 0xffffffffffffff00;
  local_238 = &PTR__lazy_ostream_002286c0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = (size_type **)&local_248;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,&local_218,&local_180,0x29d,1,2,2,"col.size()",local_2c8,"3",&local_238);
  boost::detail::shared_count::~shared_count(&sStack_280);
  _Var7 = col.column_._M_h._M_before_begin;
  if (col.column_._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    do {
      pkVar4 = (key_type *)_Var7._M_nxt[1]._M_nxt;
      if (col.super_Row_access_option.rows_ != (Row_container *)0x0) {
        p_Var6 = ((col.super_Row_access_option.rows_)->_M_t)._M_impl.super__Rb_tree_header._M_header
                 ._M_parent;
        p_Var11 = &((col.super_Row_access_option.rows_)->_M_t)._M_impl.super__Rb_tree_header.
                   _M_header;
        if (p_Var6 != (_Base_ptr)0x0) {
          _Var1 = pkVar4->rowIndex_;
          p_Var9 = p_Var11;
          do {
            bVar5 = p_Var6[1]._M_color < _Var1;
            if (!bVar5) {
              p_Var9 = p_Var6;
            }
            p_Var6 = (&p_Var6->_M_left)[bVar5];
          } while (p_Var6 != (_Base_ptr)0x0);
          if ((p_Var9 != p_Var11) && (p_Var9[1]._M_color <= _Var1)) {
            p_Var11 = p_Var9;
          }
        }
        pVar12 = std::
                 _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>_>
                 ::equal_range((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>_>
                                *)&p_Var11[1]._M_parent,pkVar4);
        std::
        _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>_>
        ::_M_erase_aux((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>_>
                        *)&p_Var11[1]._M_parent,(_Base_ptr)pVar12.first._M_node,
                       (_Base_ptr)pVar12.second._M_node);
      }
      operator_delete(pkVar4,8);
      _Var7._M_nxt = (_Var7._M_nxt)->_M_nxt;
    } while (_Var7._M_nxt != (_Hash_node_base *)0x0);
    while (col.column_._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      p_Var3 = (col.column_._M_h._M_before_begin._M_nxt)->_M_nxt;
      operator_delete(col.column_._M_h._M_before_begin._M_nxt,0x18);
      col.column_._M_h._M_before_begin._M_nxt = p_Var3;
    }
  }
  memset(col.column_._M_h._M_buckets,0,col.column_._M_h._M_bucket_count << 3);
  col.column_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  col.column_._M_h._M_element_count = 0;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_278,0,0);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x2a1);
  uVar10 = ((int)local_268 - (int)local_278) * 8 + local_260;
  if ((int)uVar10 < 0) {
    if (col.column_._M_h._M_element_count == 0) {
      local_2c8._16_4_ = 0;
      local_2c8._20_4_ = 0;
      unique0x10000ee4 = (undefined4 ***)0x0;
      local_2c8._0_8_ = (undefined **)0x0;
      local_2c8._8_4_ = 0;
      local_2c8._12_4_ = 0;
      local_2a8 = (_Bit_pointer)0x0;
      goto LAB_001cb035;
    }
    _Var7 = col.column_._M_h._M_before_begin;
    for (p_Var3 = (col.column_._M_h._M_before_begin._M_nxt)->_M_nxt;
        p_Var3 != (_Hash_node_base *)0x0; p_Var3 = p_Var3->_M_nxt) {
      p_Var8 = p_Var3;
      if (*(uint *)((long)&(p_Var3[1]._M_nxt)->_M_nxt + 4) <=
          *(uint *)((long)&(_Var7._M_nxt[1]._M_nxt)->_M_nxt + 4)) {
        p_Var8 = _Var7._M_nxt;
      }
      _Var7._M_nxt = p_Var8;
    }
    uVar10 = *(int *)((long)&(_Var7._M_nxt[1]._M_nxt)->_M_nxt + 4) + 1;
  }
  local_238 = (undefined **)((ulong)local_238 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_2c8,(long)(int)uVar10,(bool *)&local_238,
             (allocator_type *)&local_290);
  for (_Var7 = col.column_._M_h._M_before_begin; _Var7._M_nxt != (_Hash_node_base *)0x0;
      _Var7._M_nxt = (_Var7._M_nxt)->_M_nxt) {
    uVar2 = *(uint *)((long)&(_Var7._M_nxt[1]._M_nxt)->_M_nxt + 4);
    if (uVar2 < uVar10) {
      *(undefined **)(local_2c8._0_8_ + (ulong)(uVar2 >> 6) * 8) =
           (undefined *)
           ((ulong)*(undefined **)(local_2c8._0_8_ + (ulong)(uVar2 >> 6) * 8) |
           1L << ((byte)uVar2 & 0x3f));
    }
  }
LAB_001cb035:
  __last1_02.super__Bit_iterator_base._M_p._4_4_ = local_2c8._20_4_;
  __last1_02.super__Bit_iterator_base._M_p._0_4_ = local_2c8._16_4_;
  __last1_02.super__Bit_iterator_base._M_offset = local_2c8._24_4_;
  if (((ulong)unique0x10000edc & 0xffffffff) +
      (CONCAT44(local_2c8._20_4_,local_2c8._16_4_) - local_2c8._0_8_) * 8 ==
      (ulong)local_260 + (local_268 - (long)local_278) * 8) {
    __first1_02.super__Bit_iterator_base._8_8_ = 0;
    __first1_02.super__Bit_iterator_base._M_p = (_Bit_type *)local_2c8._0_8_;
    __last1_02.super__Bit_iterator_base._12_4_ = 0;
    __first2_02.super__Bit_iterator_base._8_8_ = 0;
    __first2_02.super__Bit_iterator_base._M_p = (_Bit_type *)local_278;
    bVar5 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_02,__last1_02,__first2_02);
  }
  else {
    bVar5 = false;
  }
  local_218 = (undefined **)CONCAT71(local_218._1_7_,bVar5);
  local_210 = 0;
  sStack_208.pi_ = (sp_counted_base *)0x0;
  local_290 = "col.get_content(veccont.size()) == veccont";
  local_288 = "";
  uStack_230 = uStack_230 & 0xffffffffffffff00;
  local_238 = &PTR__lazy_ostream_002283b0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_148 = "";
  local_220 = (size_type **)&local_290;
  boost::test_tools::tt_detail::report_assertion(&local_218,&local_238,&local_150,0x2a1,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_208);
  if ((undefined **)local_2c8._0_8_ != (undefined **)0x0) {
    operator_delete((void *)local_2c8._0_8_,(long)local_2a8 - local_2c8._0_8_);
  }
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x2a2);
  local_210 = local_210 & 0xffffffffffffff00;
  local_218 = &PTR__lazy_ostream_00228440;
  sStack_208.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_200 = "";
  local_250 = col.column_._M_h._M_element_count;
  local_290 = (char *)CONCAT71(local_290._1_7_,col.column_._M_h._M_element_count == 0);
  local_298 = 0;
  local_288 = (char *)0x0;
  sStack_280.pi_ = (sp_counted_base *)0x0;
  local_180 = (undefined4 **)0x1e68bf;
  local_178 = "";
  local_240 = &local_250;
  local_2c8._8_4_ = local_2c8._8_4_ & 0xffffff00;
  local_2c8._0_8_ = &PTR__lazy_ostream_00228400;
  local_2c8._16_4_ = 0x230120;
  local_2c8._20_4_ = 0;
  unique0x00005300 = (undefined4 ***)&local_240;
  local_248 = &local_298;
  uStack_230 = uStack_230 & 0xffffffffffffff00;
  local_238 = &PTR__lazy_ostream_002286c0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = (size_type **)&local_248;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_280);
  _Var7 = col.column_._M_h._M_before_begin;
  if (permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)permutation.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)permutation.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    _Var7 = col.column_._M_h._M_before_begin;
  }
  for (; _Var7._M_nxt != (_Hash_node_base *)0x0; _Var7._M_nxt = (_Var7._M_nxt)->_M_nxt) {
    pkVar4 = (key_type *)_Var7._M_nxt[1]._M_nxt;
    if (col.super_Row_access_option.rows_ != (Row_container *)0x0) {
      p_Var6 = ((col.super_Row_access_option.rows_)->_M_t)._M_impl.super__Rb_tree_header._M_header.
               _M_parent;
      p_Var11 = &((col.super_Row_access_option.rows_)->_M_t)._M_impl.super__Rb_tree_header._M_header
      ;
      if (p_Var6 != (_Base_ptr)0x0) {
        _Var1 = pkVar4->rowIndex_;
        p_Var9 = p_Var11;
        do {
          bVar5 = p_Var6[1]._M_color < _Var1;
          if (!bVar5) {
            p_Var9 = p_Var6;
          }
          p_Var6 = (&p_Var6->_M_left)[bVar5];
        } while (p_Var6 != (_Base_ptr)0x0);
        if ((p_Var9 != p_Var11) && (p_Var9[1]._M_color <= _Var1)) {
          p_Var11 = p_Var9;
        }
      }
      pVar12 = std::
               _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>_>
               ::equal_range((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>_>
                              *)&p_Var11[1]._M_parent,pkVar4);
      std::
      _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>_>
      ::_M_erase_aux((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>_>
                      *)&p_Var11[1]._M_parent,(_Base_ptr)pVar12.first._M_node,
                     (_Base_ptr)pVar12.second._M_node);
    }
    operator_delete(pkVar4,8);
  }
  std::
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&col.column_._M_h);
  if (local_278 != (void *)0x0) {
    operator_delete(local_278,local_258 - (long)local_278);
  }
  return;
}

Assistant:

void column_test_base_boundary_z2_methods() {
  std::vector<typename Column::Field_element> veccont;
  typename Column::Column_settings settings;

  Column col(std::vector<unsigned int>{0, 1, 2, 5, 6}, &settings);
  veccont = {1, 1, 1, 0, 0, 1, 1};
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(col.size(), 5);

  std::vector<unsigned int> permutation{0, 5, 2, 3, 1, 4, 6};
  col.reorder(permutation);
  veccont = {1, 0, 1, 0, 1, 1, 1};
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(col.size(), 5);

  col.clear(2);
  col.clear(6);
  veccont = {1, 0, 0, 0, 1, 1, 0};
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(col.size(), 3);

  col.clear();
  veccont = {};
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(col.size(), 0);
}